

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

int __thiscall
deqp::gls::BufferTestUtil::IndexArrayVerifier::verify
          (IndexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *pCVar1;
  byte bVar2;
  RenderContext *pRVar3;
  uint count;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var_00;
  long lVar6;
  undefined7 extraout_var;
  long lVar7;
  long lVar8;
  pointer pVVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  allocator<char> local_1d1;
  uchar *local_1d0;
  CallLogWrapper *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  RGBA threshold;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> colors;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  int local_168;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fetchedColor;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> fetchedPos;
  Random rnd;
  Surface referenceImg;
  Surface indexBufferImg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string imageSetDesc;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1d0 = tbs;
  iVar5 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  uVar13 = *(uint *)CONCAT44(extraout_var_00,iVar5);
  uVar10 = (ulong)uVar13;
  if (0x7f < (int)uVar13) {
    uVar10 = 0x80;
  }
  uVar13 = ((uint *)CONCAT44(extraout_var_00,iVar5))[1];
  uVar11 = 0x80;
  if ((int)uVar13 < 0x80) {
    uVar11 = uVar13;
  }
  threshold.m_value = 0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&fetchedPos,0x81,(allocator_type *)&rnd);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fetchedColor,0x81,(allocator_type *)&rnd);
  iVar5 = (int)uVar10;
  tcu::Surface::Surface(&indexBufferImg,iVar5,uVar11);
  tcu::Surface::Surface(&referenceImg,iVar5,uVar11);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&positions,0x100);
  lVar6 = 4;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    fVar14 = (float)(int)lVar7 / 15.0;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      fVar15 = (float)(int)lVar8 / 15.0;
      *(float *)((long)positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar8].m_data + lVar6 + -4) =
           fVar15 + fVar15 + -1.0;
      *(float *)((long)positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar8].m_data + lVar6) =
           fVar14 + fVar14 + -1.0;
    }
    lVar6 = lVar6 + 0x80;
  }
  deRandom_init(&rnd.m_rnd,0xabc231);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::resize(&colors,0x100)
  ;
  for (pVVar9 = colors.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar9 != colors.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; pVVar9 = pVVar9 + 1) {
    fVar14 = deRandom_getFloat(&rnd.m_rnd);
    pVVar9->m_data[0] = fVar14 * 0.4 + 0.1;
    fVar14 = deRandom_getFloat(&rnd.m_rnd);
    pVVar9->m_data[1] = fVar14 * 0.4 + 0.1;
    fVar14 = deRandom_getFloat(&rnd.m_rnd);
    pVVar9->m_data[2] = fVar14 * 0.4 + 0.1;
  }
  pCVar1 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x88eb,0);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8893,(GLuint)ctx);
  glu::CallLogWrapper::glViewport(pCVar1,0,0,iVar5,uVar11);
  glu::CallLogWrapper::glClearColor(pCVar1,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(pCVar1,(this->m_program->m_program).m_program);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_posLoc);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_colorLoc);
  glu::CallLogWrapper::glEnable(pCVar1,0xbe2);
  glu::CallLogWrapper::glBlendFunc(pCVar1,1,1);
  glu::CallLogWrapper::glBlendEquation(pCVar1,0x8006);
  local_1bc = (int)local_1d0 + -2;
  local_168 = (int)siglen;
  iVar5 = 0;
  local_1c8 = pCVar1;
  do {
    uVar13 = (int)local_1d0 - iVar5;
    iVar12 = iVar5;
    if (uVar13 == 0 || (int)local_1d0 < iVar5) break;
    uVar11 = 0x81;
    if (uVar13 < 0x81) {
      uVar11 = uVar13;
    }
    count = uVar11;
    if ((int)uVar13 < 2) {
      iVar12 = local_1bc;
      uVar11 = uVar13;
      count = 2;
    }
    local_1b8 = iVar5;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Bytes ",&local_1d1);
    iVar5 = local_168 + iVar12;
    local_1b0 = iVar5;
    de::toString<int>(&local_90,&local_1b0);
    std::operator+(&local_50,&local_d0,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                   &local_50," to ");
    local_1b4 = iVar5 + count + -1;
    de::toString<int>(&local_70,&local_1b4);
    std::operator+(&imageSetDesc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                   &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&rnd);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    pCVar1 = local_1c8;
    glu::CallLogWrapper::glClear(local_1c8,0x4000);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_positionBuf);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8892,
               (long)positions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)positions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               positions.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_colorBuf);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8892,
               (long)colors.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)colors.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               colors.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_colorLoc,3,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glDrawElements(pCVar1,3,count,0x1401,(void *)(long)iVar5);
    pRVar3 = (this->super_BufferVerifierBase).m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&rnd,&indexBufferImg);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&rnd);
    pCVar1 = local_1c8;
    for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
      *(undefined8 *)
       fetchedPos.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar10].m_data =
           *(undefined8 *)
            positions.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[sig[uVar10 + (long)iVar12 + (long)local_168]].
            m_data;
    }
    pVVar9 = fetchedColor.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
      bVar2 = sig[uVar10 + (long)iVar12 + (long)local_168];
      pVVar9->m_data[2] =
           colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start[bVar2].m_data[2];
      *(undefined8 *)pVVar9->m_data =
           *(undefined8 *)
            colors.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[bVar2].m_data;
      pVVar9 = pVVar9 + 1;
    }
    glu::CallLogWrapper::glClear(local_1c8,0x4000);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_positionBuf);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8892,
               (long)fetchedPos.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)fetchedPos.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               fetchedPos.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_colorBuf);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8892,
               (long)fetchedColor.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)fetchedColor.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               fetchedColor.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_colorLoc,3,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glDrawArrays(pCVar1,3,0,count);
    pRVar3 = (this->super_BufferVerifierBase).m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&rnd,&referenceImg);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&rnd);
    bVar4 = tcu::pixelThresholdCompare
                      ((this->super_BufferVerifierBase).m_log,"RenderResult",
                       imageSetDesc._M_dataplus._M_p,&referenceImg,&indexBufferImg,&threshold,
                       COMPARE_LOG_RESULT);
    iVar12 = local_1b8;
    uVar10 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
    iVar5 = uVar11 + local_1b8;
    std::__cxx11::string::~string((string *)&imageSetDesc);
  } while ((char)uVar10 != '\0');
  glu::CallLogWrapper::glBindVertexArray(local_1c8,0);
  bVar4 = (int)local_1d0 <= iVar12;
  tcu::Surface::~Surface(&referenceImg);
  tcu::Surface::~Surface(&indexBufferImg);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&fetchedColor.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return (int)CONCAT71((int7)(uVar10 >> 8),bVar4);
}

Assistant:

bool IndexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					viewportW			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_WIDTH, renderTarget.getWidth());
	const int					viewportH			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_HEIGHT, renderTarget.getHeight());
	const int					minBytesPerBatch	= 2;
	const tcu::RGBA				threshold			(0,0,0,0);

	std::vector<tcu::Vec2>		positions;
	std::vector<tcu::Vec3>		colors;

	std::vector<tcu::Vec2>		fetchedPos			(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);
	std::vector<tcu::Vec3>		fetchedColor		(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);

	tcu::Surface				indexBufferImg		(viewportW, viewportH);
	tcu::Surface				referenceImg		(viewportW, viewportH);

	int							numVerified			= 0;
	bool						isOk				= true;

	DE_STATIC_ASSERT(sizeof(tcu::Vec2) == sizeof(float)*2);
	DE_STATIC_ASSERT(sizeof(tcu::Vec3) == sizeof(float)*3);

	computeIndexVerifierPositions(positions);
	computeIndexVerifierColors(colors);

	// Reset buffer bindings.
	glBindVertexArray			(m_vao);
	glBindBuffer				(GL_PIXEL_PACK_BUFFER,		0);
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	buffer);

	// Setup rendering state.
	glViewport					(0, 0, viewportW, viewportH);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(m_posLoc);
	glEnableVertexAttribArray	(m_colorLoc);
	glEnable					(GL_BLEND);
	glBlendFunc					(GL_ONE, GL_ONE);
	glBlendEquation				(GL_FUNC_ADD);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < minBytesPerBatch;
		int		numBytesToVerify	= isLeftoverBatch ? minBytesPerBatch			: de::min(MAX_LINES_PER_INDEX_ARRAY_DRAW+1, numRemaining);
		int		curOffset			= isLeftoverBatch ? (numBytes-minBytesPerBatch)	: numVerified;
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		// Step 1: Render using index buffer.
		glClear					(GL_COLOR_BUFFER_BIT);

		glBindBuffer			(GL_ARRAY_BUFFER, m_positionBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glBindBuffer			(GL_ARRAY_BUFFER, m_colorBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(colors.size()*sizeof(colors[0])), &colors[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glDrawElements			(GL_LINE_STRIP, numBytesToVerify, GL_UNSIGNED_BYTE, (void*)(deUintptr)(offset+curOffset));
		glu::readPixels			(m_renderCtx, 0, 0, indexBufferImg.getAccess());

		// Step 2: Do manual fetch and render without index buffer.
		execVertexFetch(&fetchedPos[0], &positions[0], refPtr+offset+curOffset, numBytesToVerify);
		execVertexFetch(&fetchedColor[0], &colors[0], refPtr+offset+curOffset, numBytesToVerify);

		glClear					(GL_COLOR_BUFFER_BIT);

		glBindBuffer			(GL_ARRAY_BUFFER, m_positionBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(fetchedPos.size()*sizeof(fetchedPos[0])), &fetchedPos[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glBindBuffer			(GL_ARRAY_BUFFER, m_colorBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(fetchedColor.size()*sizeof(fetchedColor[0])), &fetchedColor[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glDrawArrays			(GL_LINE_STRIP, 0, numBytesToVerify);
		glu::readPixels			(m_renderCtx, 0, 0, referenceImg.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), referenceImg, indexBufferImg, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}